

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

char * lj_debug_slotname(GCproto *pt,BCIns *ip,BCReg slot,char **name)

{
  GCproto *pGVar1;
  char cVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  BCIns *pBVar6;
  
  pGVar1 = pt + 1;
  pcVar3 = debug_varname((GCproto *)(ulong)(pt->varinfo).ptr32,
                         (BCPos)((ulong)((long)ip - (long)pGVar1) >> 2),slot);
  do {
    if (pcVar3 != (char *)0x0) {
      *name = pcVar3;
      return "local";
    }
    do {
      while( true ) {
        pBVar6 = ip;
        ip = pBVar6 + -1;
        if (ip <= pGVar1) {
          return (char *)0x0;
        }
        uVar5 = pBVar6[-1];
        uVar4 = uVar5 >> 8 & 0xff;
        if ((lj_bc_mode[uVar5 & 0xff] & 7) == 1) break;
        if (((lj_bc_mode[uVar5 & 0xff] & 7) == 2) && (uVar4 <= slot)) {
          if ((uVar5 & 0xff) != 0x2c) {
            return (char *)0x0;
          }
          if (slot <= uVar5 >> 0x10) {
            return (char *)0x0;
          }
        }
      }
    } while (uVar4 != slot);
    if ((char)uVar5 != '\x12') {
      uVar4 = uVar5 & 0xff;
      if (uVar4 == 0x2d) {
        pcVar3 = (char *)(ulong)(pt->uvinfo).ptr32;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "";
        }
        else if (0xffff < uVar5) {
          uVar5 = uVar5 >> 0x10;
          do {
            do {
              cVar2 = *pcVar3;
              pcVar3 = pcVar3 + 1;
            } while (cVar2 != '\0');
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        *name = pcVar3;
        return "upvalue";
      }
      if (uVar4 != 0x39) {
        if (uVar4 != 0x36) {
          return (char *)0x0;
        }
        *name = (char *)((ulong)*(uint *)((ulong)(pt->k).ptr32 + (long)(int)~(uVar5 >> 0x10) * 4) +
                        0x10);
        return "global";
      }
      *name = (char *)((ulong)*(uint *)((ulong)(pt->k).ptr32 +
                                       (long)(int)(~uVar5 >> 0x10 | 0xffffff00) * 4) + 0x10);
      uVar4 = pBVar6[-2];
      if ((((char)uVar4 == '\x12') && ((uVar4 >> 8 & 0xff) == slot + 1)) &&
         (uVar4 >> 0x10 == uVar5 >> 0x18)) {
        return "method";
      }
      return "field";
    }
    slot = uVar5 >> 0x10;
    pcVar3 = debug_varname((GCproto *)(ulong)(pt->varinfo).ptr32,
                           (BCPos)((ulong)((long)ip - (long)pGVar1) >> 2),slot);
  } while( true );
}

Assistant:

const char *lj_debug_slotname(GCproto *pt, const BCIns *ip, BCReg slot,
			      const char **name)
{
  const char *lname;
restart:
  lname = debug_varname(pt, proto_bcpos(pt, ip), slot);
  if (lname != NULL) { *name = lname; return "local"; }
  while (--ip > proto_bc(pt)) {
    BCIns ins = *ip;
    BCOp op = bc_op(ins);
    BCReg ra = bc_a(ins);
    if (bcmode_a(op) == BCMbase) {
      if (slot >= ra && (op != BC_KNIL || slot <= bc_d(ins)))
	return NULL;
    } else if (bcmode_a(op) == BCMdst && ra == slot) {
      switch (bc_op(ins)) {
      case BC_MOV:
	if (ra == slot) { slot = bc_d(ins); goto restart; }
	break;
      case BC_GGET:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_d(ins))));
	return "global";
      case BC_TGETS:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_c(ins))));
	if (ip > proto_bc(pt)) {
	  BCIns insp = ip[-1];
	  if (bc_op(insp) == BC_MOV && bc_a(insp) == ra+1+LJ_FR2 &&
	      bc_d(insp) == bc_b(ins))
	    return "method";
	}
	return "field";
      case BC_UGET:
	*name = lj_debug_uvname(pt, bc_d(ins));
	return "upvalue";
      default:
	return NULL;
      }
    }
  }
  return NULL;
}